

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

Array<asl::Map<asl::String,_asl::String>::KeyVal> * __thiscall
asl::Array<asl::Map<asl::String,_asl::String>::KeyVal>::operator=
          (Array<asl::Map<asl::String,_asl::String>::KeyVal> *this,
          Array<asl::Map<asl::String,_asl::String>::KeyVal> *b)

{
  int iVar1;
  Data *pDVar2;
  Array<asl::Map<asl::String,_asl::String>::KeyVal> *__ptr;
  Array<asl::Map<asl::String,_asl::String>::KeyVal> *b_local;
  Array<asl::Map<asl::String,_asl::String>::KeyVal> *this_local;
  
  if (this->_a != b->_a) {
    __ptr = b;
    pDVar2 = d(this);
    iVar1 = AtomicCount::operator--(&pDVar2->rc);
    if (iVar1 == 0) {
      free(this,__ptr);
    }
    this->_a = b->_a;
    pDVar2 = d(this);
    AtomicCount::operator++(&pDVar2->rc);
  }
  return this;
}

Assistant:

Array& operator=(const Array& b)
	{
		if (_a == b._a)
			return *this;
		if(--d().rc==0) free();
		_a = b._a;
		++d().rc;
		return *this;
	}